

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

uint stb_rand(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int i;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if ((ulong)(uint)stb__mt_index < 0x9c0) {
    uVar5 = *(uint *)((long)stb__mt_buffer + (ulong)(uint)stb__mt_index);
    stb__mt_index = stb__mt_index + 4;
  }
  else {
    if (stb__mt_index != 0x9c0) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        uVar5 = uVar5 * 0x7ff8a3ed + 0x2aa01d31;
        stb__mt_buffer[lVar4] = (uVar5 * 0x10000 | uVar5 >> 0x10) ^ 0x31415926;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
    }
    lVar4 = 0;
    uVar5 = stb__mt_buffer[0];
    do {
      uVar1 = stb__mt_buffer[lVar4 + 1];
      uVar6 = 0x9908b0df;
      if ((uVar1 & 1) == 0) {
        uVar6 = 0;
      }
      stb__mt_buffer[lVar4] =
           uVar6 ^ stb__mt_buffer[lVar4 + 0x18d] ^ (uVar1 & 0x7ffffffe | uVar5 & 0x80000000) >> 1;
      lVar4 = lVar4 + 1;
      uVar5 = uVar1;
    } while (lVar4 != 0xe3);
    lVar4 = 0;
    uVar5 = stb__mt_buffer[0xe3];
    do {
      uVar1 = stb__mt_buffer[lVar4 + 0xe4];
      uVar6 = stb__mt_buffer[lVar4 + 0xe5];
      uVar2 = stb__mt_buffer[lVar4 + 0xe6];
      uVar3 = stb__mt_buffer[lVar4 + 0xe7];
      stb__mt_buffer[lVar4 + 0xe3] =
           (int)(uVar1 << 0x1f) >> 0x1f & 0x9908b0dfU ^ stb__mt_buffer[lVar4] ^
           (uVar1 & 0x7ffffffe | uVar5 & 0x80000000) >> 1;
      stb__mt_buffer[lVar4 + 0xe4] =
           (int)(uVar6 << 0x1f) >> 0x1f & 0x9908b0dfU ^ stb__mt_buffer[lVar4 + 1] ^
           (uVar6 & 0x7ffffffe | uVar1 & 0x80000000) >> 1;
      stb__mt_buffer[lVar4 + 0xe5] =
           (int)(uVar2 << 0x1f) >> 0x1f & 0x9908b0dfU ^ stb__mt_buffer[lVar4 + 2] ^
           (uVar2 & 0x7ffffffe | uVar6 & 0x80000000) >> 1;
      stb__mt_buffer[lVar4 + 0xe6] =
           (int)(uVar3 << 0x1f) >> 0x1f & 0x9908b0dfU ^ stb__mt_buffer[lVar4 + 3] ^
           (uVar3 & 0x7ffffffe | uVar2 & 0x80000000) >> 1;
      lVar4 = lVar4 + 4;
      uVar5 = uVar3;
    } while (lVar4 != 0x18c);
    uVar5 = 0x9908b0df;
    if ((stb__mt_buffer[0] & 1) == 0) {
      uVar5 = 0;
    }
    stb__mt_buffer[0x26f] =
         uVar5 ^ stb__mt_buffer[0x18c] ^
         (stb__mt_buffer[0] & 0x7ffffffe | stb__mt_buffer[0x26f] & 0x80000000) >> 1;
    stb__mt_index = 4;
    uVar5 = stb__mt_buffer[0];
  }
  uVar5 = uVar5 >> 0xb ^ uVar5;
  uVar5 = (uVar5 & 0x13a58ad) << 7 ^ uVar5;
  uVar5 = (uVar5 & 0x1df8c) << 0xf ^ uVar5;
  return uVar5 >> 0x12 ^ uVar5;
}

Assistant:

unsigned int stb_rand()
{
   unsigned int  * b = stb__mt_buffer;
   int idx = stb__mt_index;
   unsigned int  s,r;
   int i;
	
   if (idx >= STB__MT_LEN*sizeof(unsigned int)) {
      if (idx > STB__MT_LEN*sizeof(unsigned int))
         stb_srand(0);
      idx = 0;
      i = 0;
      for (; i < STB__MT_IB; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i + STB__MT_IA] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      for (; i < STB__MT_LEN-1; i++) {
         s = STB__TWIST(b, i, i+1);
         b[i] = b[i - STB__MT_IB] ^ (s >> 1) ^ STB__MAGIC(s);
      }
      
      s = STB__TWIST(b, STB__MT_LEN-1, 0);
      b[STB__MT_LEN-1] = b[STB__MT_IA-1] ^ (s >> 1) ^ STB__MAGIC(s);
   }
   stb__mt_index = idx + sizeof(unsigned int);
   
   r = *(unsigned int *)((unsigned char *)b + idx);
   
   r ^= (r >> 11);
   r ^= (r << 7) & 0x9D2C5680;
   r ^= (r << 15) & 0xEFC60000;
   r ^= (r >> 18);
   
   return r;
}